

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_intersector1.cpp
# Opt level: O2

bool embree::sse2::
     BVHNIntersector1<4,_16777232,_false,_embree::sse2::ArrayIntersector1<embree::sse2::TriangleMiMBIntersector1Moeller<4,_true>_>_>
     ::pointQuery(Intersectors *This,PointQuery *query,PointQueryContext *context)

{
  ulong uVar1;
  Geometry *this;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  uint uVar5;
  undefined1 (*pauVar6) [16];
  bool bVar7;
  bool bVar8;
  ulong uVar9;
  ulong uVar10;
  uint uVar11;
  byte bVar12;
  undefined1 (*pauVar13) [16];
  long lVar14;
  size_t i;
  long lVar15;
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  float fVar32;
  float fVar38;
  float fVar39;
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  float fVar40;
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  float fVar47;
  float fVar52;
  float fVar53;
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  float fVar54;
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  float fVar55;
  float fVar58;
  float fVar59;
  undefined1 auVar56 [16];
  float fVar60;
  undefined1 auVar57 [16];
  float fVar61;
  float fVar62;
  float fVar63;
  float fVar64;
  float fVar65;
  float fVar66;
  float fVar67;
  float fVar68;
  float fVar69;
  float fVar70;
  float fVar71;
  float fVar72;
  float fVar73;
  float fVar74;
  float fVar75;
  float fVar76;
  float fVar77;
  vfloat<4> tNear;
  StackItemT<embree::NodeRefPtr<4>_> stack [244];
  float local_1058 [6];
  long local_1040;
  long local_1038;
  ulong local_1030;
  float local_1028;
  float fStack_1024;
  float fStack_1020;
  float fStack_101c;
  float local_1018;
  float fStack_1014;
  float fStack_1010;
  float fStack_100c;
  float local_1008;
  float fStack_1004;
  float fStack_1000;
  float fStack_ffc;
  float local_ff8;
  float fStack_ff4;
  float fStack_ff0;
  float fStack_fec;
  undefined1 local_fe8 [8];
  float fStack_fe0;
  float fStack_fdc;
  undefined1 local_fd8 [8];
  float fStack_fd0;
  float fStack_fcc;
  float local_fc8;
  float fStack_fc4;
  float fStack_fc0;
  float fStack_fbc;
  float local_fb8;
  float fStack_fb4;
  float fStack_fb0;
  float fStack_fac;
  float local_fa8;
  float fStack_fa4;
  float fStack_fa0;
  float fStack_f9c;
  float local_f98;
  float fStack_f94;
  float fStack_f90;
  float fStack_f8c;
  float local_f88;
  float fStack_f84;
  float fStack_f80;
  float fStack_f7c;
  long local_f78;
  undefined4 uStack_f70;
  undefined1 local_f68 [3896];
  
  local_f78 = *(long *)&This->ptr[1].bounds.bounds0.lower.field_0;
  if (local_f78 == 8) {
    return false;
  }
  uStack_f70 = 0;
  fVar61 = (query->p).field_0.field_0.x;
  fVar65 = (query->p).field_0.field_0.y;
  fVar69 = (query->p).field_0.field_0.z;
  fVar76 = (context->query_radius).field_0.m128[0];
  fVar73 = (context->query_radius).field_0.m128[1];
  fVar74 = (context->query_radius).field_0.m128[2];
  if (context->query_type == POINT_QUERY_TYPE_SPHERE) {
    fStack_fc0 = 0.0;
    fStack_fc4 = 0.0;
    fVar77 = query->radius * query->radius;
  }
  else {
    fVar77 = (context->query_radius).field_0.m128[0];
    fVar62 = (context->query_radius).field_0.m128[1];
    fStack_fc0 = (context->query_radius).field_0.m128[2];
    fStack_fc4 = (context->query_radius).field_0.m128[3];
    fStack_fc0 = fStack_fc0 * fStack_fc0;
    fStack_fc4 = fStack_fc4 * fStack_fc4;
    fVar77 = fStack_fc0 + fVar62 * fVar62 + fVar77 * fVar77;
  }
  pauVar13 = (undefined1 (*) [16])local_f68;
  bVar8 = false;
  local_f98 = fVar61;
  fStack_f94 = fVar61;
  fStack_f90 = fVar61;
  fStack_f8c = fVar61;
  local_fa8 = fVar65;
  fStack_fa4 = fVar65;
  fStack_fa0 = fVar65;
  fStack_f9c = fVar65;
  local_fb8 = fVar69;
  fStack_fb4 = fVar69;
  fStack_fb0 = fVar69;
  fStack_fac = fVar69;
  fVar62 = fVar61;
  fVar63 = fVar61;
  fVar64 = fVar61;
  fVar66 = fVar65;
  fVar67 = fVar65;
  fVar68 = fVar65;
  fVar70 = fVar69;
  fVar71 = fVar69;
  fVar72 = fVar69;
  do {
    local_ff8 = fVar61 - fVar76;
    fStack_ff4 = fVar62 - fVar76;
    fStack_ff0 = fVar63 - fVar76;
    fStack_fec = fVar64 - fVar76;
    local_1008 = fVar61 + fVar76;
    fStack_1004 = fVar62 + fVar76;
    fStack_1000 = fVar63 + fVar76;
    fStack_ffc = fVar64 + fVar76;
    local_1018 = fVar65 - fVar73;
    fStack_1014 = fVar66 - fVar73;
    fStack_1010 = fVar67 - fVar73;
    fStack_100c = fVar68 - fVar73;
    local_fd8._0_4_ = fVar73 + fVar65;
    local_fd8._4_4_ = fVar73 + fVar66;
    fStack_fd0 = fVar73 + fVar67;
    fStack_fcc = fVar73 + fVar68;
    local_1028 = fVar69 - fVar74;
    fStack_1024 = fVar70 - fVar74;
    fStack_1020 = fVar71 - fVar74;
    fStack_101c = fVar72 - fVar74;
    local_fe8._0_4_ = fVar74 + fVar69;
    local_fe8._4_4_ = fVar74 + fVar70;
    fStack_fe0 = fVar74 + fVar71;
    fStack_fdc = fVar74 + fVar72;
    fVar73 = fVar76 * fVar76;
    fVar74 = fVar76 * fVar76;
    fVar75 = fVar76 * fVar76;
    fVar76 = fVar76 * fVar76;
    local_f88 = fVar73;
    fStack_f84 = fVar74;
    fStack_f80 = fVar75;
    fStack_f7c = fVar76;
    local_fc8 = fVar77;
    fStack_fbc = fStack_fc4;
LAB_0057577a:
    do {
      do {
        if (pauVar13 == (undefined1 (*) [16])&local_f78) {
          return bVar8;
        }
        pauVar6 = pauVar13 + -1;
        pauVar13 = pauVar13 + -1;
      } while (fVar77 < *(float *)((long)*pauVar6 + 8));
      uVar10 = *(ulong *)*pauVar13;
LAB_00575798:
      uVar11 = (uint)uVar10;
      if (context->query_type != POINT_QUERY_TYPE_SPHERE) {
        if ((uVar10 & 8) != 0) goto LAB_00575c5b;
        uVar9 = uVar10 & 0xfffffffffffffff0;
        fVar32 = query->time;
        auVar18._4_4_ = fVar32;
        auVar18._0_4_ = fVar32;
        auVar18._8_4_ = fVar32;
        auVar18._12_4_ = fVar32;
        auVar28._0_4_ = *(float *)(uVar9 + 0x80) * fVar32 + *(float *)(uVar9 + 0x20);
        auVar28._4_4_ = *(float *)(uVar9 + 0x84) * fVar32 + *(float *)(uVar9 + 0x24);
        auVar28._8_4_ = *(float *)(uVar9 + 0x88) * fVar32 + *(float *)(uVar9 + 0x28);
        auVar28._12_4_ = *(float *)(uVar9 + 0x8c) * fVar32 + *(float *)(uVar9 + 0x2c);
        auVar25._0_4_ = *(float *)(uVar9 + 0xa0) * fVar32 + *(float *)(uVar9 + 0x40);
        auVar25._4_4_ = *(float *)(uVar9 + 0xa4) * fVar32 + *(float *)(uVar9 + 0x44);
        auVar25._8_4_ = *(float *)(uVar9 + 0xa8) * fVar32 + *(float *)(uVar9 + 0x48);
        auVar25._12_4_ = *(float *)(uVar9 + 0xac) * fVar32 + *(float *)(uVar9 + 0x4c);
        auVar21._0_4_ = *(float *)(uVar9 + 0xc0) * fVar32 + *(float *)(uVar9 + 0x60);
        auVar21._4_4_ = *(float *)(uVar9 + 0xc4) * fVar32 + *(float *)(uVar9 + 100);
        auVar21._8_4_ = *(float *)(uVar9 + 200) * fVar32 + *(float *)(uVar9 + 0x68);
        auVar21._12_4_ = *(float *)(uVar9 + 0xcc) * fVar32 + *(float *)(uVar9 + 0x6c);
        auVar35._0_4_ = *(float *)(uVar9 + 0x90) * fVar32 + *(float *)(uVar9 + 0x30);
        auVar35._4_4_ = *(float *)(uVar9 + 0x94) * fVar32 + *(float *)(uVar9 + 0x34);
        auVar35._8_4_ = *(float *)(uVar9 + 0x98) * fVar32 + *(float *)(uVar9 + 0x38);
        auVar35._12_4_ = *(float *)(uVar9 + 0x9c) * fVar32 + *(float *)(uVar9 + 0x3c);
        auVar46._0_4_ = *(float *)(uVar9 + 0xb0) * fVar32 + *(float *)(uVar9 + 0x50);
        auVar46._4_4_ = *(float *)(uVar9 + 0xb4) * fVar32 + *(float *)(uVar9 + 0x54);
        auVar46._8_4_ = *(float *)(uVar9 + 0xb8) * fVar32 + *(float *)(uVar9 + 0x58);
        auVar46._12_4_ = *(float *)(uVar9 + 0xbc) * fVar32 + *(float *)(uVar9 + 0x5c);
        auVar42._0_4_ = *(float *)(uVar9 + 0xd0) * fVar32 + *(float *)(uVar9 + 0x70);
        auVar42._4_4_ = *(float *)(uVar9 + 0xd4) * fVar32 + *(float *)(uVar9 + 0x74);
        auVar42._8_4_ = *(float *)(uVar9 + 0xd8) * fVar32 + *(float *)(uVar9 + 0x78);
        auVar42._12_4_ = *(float *)(uVar9 + 0xdc) * fVar32 + *(float *)(uVar9 + 0x7c);
        auVar50._4_4_ = fVar62;
        auVar50._0_4_ = fVar61;
        auVar50._8_4_ = fVar63;
        auVar50._12_4_ = fVar64;
        auVar23 = maxps(auVar50,auVar28);
        auVar23 = minps(auVar23,auVar35);
        fVar32 = auVar23._0_4_ - fVar61;
        fVar39 = auVar23._4_4_ - fVar62;
        fVar47 = auVar23._8_4_ - fVar63;
        fVar53 = auVar23._12_4_ - fVar64;
        auVar57._4_4_ = fVar66;
        auVar57._0_4_ = fVar65;
        auVar57._8_4_ = fVar67;
        auVar57._12_4_ = fVar68;
        auVar23 = maxps(auVar57,auVar25);
        auVar23 = minps(auVar23,auVar46);
        fVar55 = auVar23._0_4_ - fVar65;
        fVar58 = auVar23._4_4_ - fVar66;
        fVar59 = auVar23._8_4_ - fVar67;
        fVar60 = auVar23._12_4_ - fVar68;
        auVar51._4_4_ = fVar70;
        auVar51._0_4_ = fVar69;
        auVar51._8_4_ = fVar71;
        auVar51._12_4_ = fVar72;
        auVar23 = maxps(auVar51,auVar21);
        auVar23 = minps(auVar23,auVar42);
        fVar38 = auVar23._0_4_ - fVar69;
        fVar40 = auVar23._4_4_ - fVar70;
        fVar52 = auVar23._8_4_ - fVar71;
        fVar54 = auVar23._12_4_ - fVar72;
        local_1058[0] = fVar38 * fVar38 + fVar55 * fVar55 + fVar32 * fVar32;
        local_1058[1] = fVar40 * fVar40 + fVar58 * fVar58 + fVar39 * fVar39;
        local_1058[2] = fVar52 * fVar52 + fVar59 * fVar59 + fVar47 * fVar47;
        local_1058[3] = fVar54 * fVar54 + fVar60 * fVar60 + fVar53 * fVar53;
        uVar4 = (uint)(((auVar21._0_4_ <= (float)local_fe8._0_4_ && local_ff8 <= auVar35._0_4_) &&
                       (auVar25._0_4_ <= (float)local_fd8._0_4_ && auVar28._0_4_ <= local_1008)) &&
                      (local_1028 <= auVar42._0_4_ &&
                      (local_1018 <= auVar46._0_4_ && auVar28._0_4_ <= auVar35._0_4_)));
        auVar49._0_4_ = -uVar4;
        uVar5 = (uint)(((auVar21._4_4_ <= (float)local_fe8._4_4_ && fStack_ff4 <= auVar35._4_4_) &&
                       (auVar25._4_4_ <= (float)local_fd8._4_4_ && auVar28._4_4_ <= fStack_1004)) &&
                      (fStack_1024 <= auVar42._4_4_ &&
                      (fStack_1014 <= auVar46._4_4_ && auVar28._4_4_ <= auVar35._4_4_)));
        auVar49._4_4_ = -uVar5;
        uVar3 = (uint)(((auVar21._8_4_ <= fStack_fe0 && fStack_ff0 <= auVar35._8_4_) &&
                       (auVar25._8_4_ <= fStack_fd0 && auVar28._8_4_ <= fStack_1000)) &&
                      (fStack_1020 <= auVar42._8_4_ &&
                      (fStack_1010 <= auVar46._8_4_ && auVar28._8_4_ <= auVar35._8_4_)));
        auVar49._8_4_ = -uVar3;
        uVar2 = (uint)(((auVar21._12_4_ <= fStack_fdc && fStack_fec <= auVar35._12_4_) &&
                       (auVar25._12_4_ <= fStack_fcc && auVar28._12_4_ <= fStack_ffc)) &&
                      (fStack_101c <= auVar42._12_4_ &&
                      (fStack_100c <= auVar46._12_4_ && auVar28._12_4_ <= auVar35._12_4_)));
        auVar49._12_4_ = -uVar2;
        if ((uVar11 & 7) == 6) goto LAB_005759c0;
        auVar49._0_4_ = uVar4 * -0x80000000;
        auVar49._4_4_ = uVar5 * -0x80000000;
        auVar49._8_4_ = uVar3 * -0x80000000;
        auVar49._12_4_ = uVar2 * -0x80000000;
LAB_0057586f:
        uVar11 = movmskps(uVar11 & 7,auVar49);
LAB_00575872:
        if (uVar11 != 0) {
          uVar9 = uVar10 & 0xfffffffffffffff0;
          lVar14 = 0;
          if (uVar11 != 0) {
            for (; (uVar11 >> lVar14 & 1) == 0; lVar14 = lVar14 + 1) {
            }
          }
          uVar10 = *(ulong *)(uVar9 + lVar14 * 8);
          uVar11 = uVar11 - 1 & uVar11;
          if (uVar11 != 0) {
            fVar32 = local_1058[lVar14];
            lVar14 = 0;
            if (uVar11 != 0) {
              for (; (uVar11 >> lVar14 & 1) == 0; lVar14 = lVar14 + 1) {
              }
            }
            uVar1 = *(ulong *)(uVar9 + lVar14 * 8);
            fVar38 = local_1058[lVar14];
            uVar11 = uVar11 - 1 & uVar11;
            if (uVar11 == 0) {
              if ((uint)fVar32 < (uint)fVar38) {
                *(ulong *)*pauVar13 = uVar1;
                *(float *)((long)*pauVar13 + 8) = fVar38;
                pauVar13 = pauVar13 + 1;
              }
              else {
                *(ulong *)*pauVar13 = uVar10;
                *(float *)((long)*pauVar13 + 8) = fVar32;
                pauVar13 = pauVar13 + 1;
                uVar10 = uVar1;
              }
            }
            else {
              auVar17._8_4_ = fVar32;
              auVar17._0_8_ = uVar10;
              auVar17._12_4_ = 0;
              auVar22._8_4_ = fVar38;
              auVar22._0_8_ = uVar1;
              auVar22._12_4_ = 0;
              lVar14 = 0;
              if (uVar11 != 0) {
                for (; (uVar11 >> lVar14 & 1) == 0; lVar14 = lVar14 + 1) {
                }
              }
              uVar10 = *(ulong *)(uVar9 + lVar14 * 8);
              fVar39 = local_1058[lVar14];
              auVar26._8_4_ = fVar39;
              auVar26._0_8_ = uVar10;
              auVar26._12_4_ = 0;
              auVar29._8_4_ = -(uint)((int)fVar32 < (int)fVar38);
              uVar11 = uVar11 - 1 & uVar11;
              if (uVar11 == 0) {
                auVar29._4_4_ = auVar29._8_4_;
                auVar29._0_4_ = auVar29._8_4_;
                auVar29._12_4_ = auVar29._8_4_;
                auVar18 = auVar17 & auVar29 | ~auVar29 & auVar22;
                auVar23 = auVar22 & auVar29 | ~auVar29 & auVar17;
                auVar30._8_4_ = -(uint)(auVar18._8_4_ < (int)fVar39);
                auVar30._0_8_ = CONCAT44(auVar30._8_4_,auVar30._8_4_);
                auVar30._12_4_ = auVar30._8_4_;
                uVar10 = ~auVar30._0_8_ & uVar10 | auVar18._0_8_ & auVar30._0_8_;
                auVar18 = auVar26 & auVar30 | ~auVar30 & auVar18;
                auVar19._8_4_ = -(uint)(auVar23._8_4_ < auVar18._8_4_);
                auVar19._4_4_ = auVar19._8_4_;
                auVar19._0_4_ = auVar19._8_4_;
                auVar19._12_4_ = auVar19._8_4_;
                *pauVar13 = ~auVar19 & auVar23 | auVar18 & auVar19;
                pauVar13[1] = auVar23 & auVar19 | ~auVar19 & auVar18;
                pauVar13 = pauVar13 + 2;
              }
              else {
                lVar14 = 0;
                if (uVar11 != 0) {
                  for (; (uVar11 >> lVar14 & 1) == 0; lVar14 = lVar14 + 1) {
                  }
                }
                fVar32 = local_1058[lVar14];
                auVar36._8_4_ = fVar32;
                auVar36._0_8_ = *(undefined8 *)(uVar9 + lVar14 * 8);
                auVar36._12_4_ = 0;
                auVar31._4_4_ = auVar29._8_4_;
                auVar31._0_4_ = auVar29._8_4_;
                auVar31._8_4_ = auVar29._8_4_;
                auVar31._12_4_ = auVar29._8_4_;
                auVar18 = auVar17 & auVar31 | ~auVar31 & auVar22;
                auVar23 = auVar22 & auVar31 | ~auVar31 & auVar17;
                auVar43._0_4_ = -(uint)((int)fVar39 < (int)fVar32);
                auVar43._4_4_ = -(uint)((int)fVar39 < (int)fVar32);
                auVar43._8_4_ = -(uint)((int)fVar39 < (int)fVar32);
                auVar43._12_4_ = -(uint)((int)fVar39 < (int)fVar32);
                auVar49 = auVar26 & auVar43 | ~auVar43 & auVar36;
                auVar44 = ~auVar43 & auVar26 | auVar36 & auVar43;
                auVar27._8_4_ = -(uint)(auVar23._8_4_ < auVar44._8_4_);
                auVar27._4_4_ = auVar27._8_4_;
                auVar27._0_4_ = auVar27._8_4_;
                auVar27._12_4_ = auVar27._8_4_;
                auVar37 = auVar23 & auVar27 | ~auVar27 & auVar44;
                auVar24._8_4_ = -(uint)(auVar18._8_4_ < auVar49._8_4_);
                auVar24._0_8_ = CONCAT44(auVar24._8_4_,auVar24._8_4_);
                auVar24._12_4_ = auVar24._8_4_;
                uVar10 = auVar18._0_8_ & auVar24._0_8_ | ~auVar24._0_8_ & auVar49._0_8_;
                auVar18 = ~auVar24 & auVar18 | auVar49 & auVar24;
                auVar20._8_4_ = -(uint)(auVar18._8_4_ < auVar37._8_4_);
                auVar20._4_4_ = auVar20._8_4_;
                auVar20._0_4_ = auVar20._8_4_;
                auVar20._12_4_ = auVar20._8_4_;
                *pauVar13 = ~auVar27 & auVar23 | auVar44 & auVar27;
                pauVar13[1] = ~auVar20 & auVar18 | auVar37 & auVar20;
                pauVar13[2] = auVar18 & auVar20 | ~auVar20 & auVar37;
                pauVar13 = pauVar13 + 3;
              }
            }
          }
          goto LAB_00575798;
        }
        goto LAB_0057577a;
      }
      if ((uVar10 & 8) == 0) {
        uVar9 = uVar10 & 0xfffffffffffffff0;
        fVar32 = query->time;
        auVar18._4_4_ = fVar32;
        auVar18._0_4_ = fVar32;
        auVar18._8_4_ = fVar32;
        auVar18._12_4_ = fVar32;
        auVar23._0_4_ = *(float *)(uVar9 + 0x80) * fVar32 + *(float *)(uVar9 + 0x20);
        auVar23._4_4_ = *(float *)(uVar9 + 0x84) * fVar32 + *(float *)(uVar9 + 0x24);
        auVar23._8_4_ = *(float *)(uVar9 + 0x88) * fVar32 + *(float *)(uVar9 + 0x28);
        auVar23._12_4_ = *(float *)(uVar9 + 0x8c) * fVar32 + *(float *)(uVar9 + 0x2c);
        auVar33._0_4_ = *(float *)(uVar9 + 0xa0) * fVar32 + *(float *)(uVar9 + 0x40);
        auVar33._4_4_ = *(float *)(uVar9 + 0xa4) * fVar32 + *(float *)(uVar9 + 0x44);
        auVar33._8_4_ = *(float *)(uVar9 + 0xa8) * fVar32 + *(float *)(uVar9 + 0x48);
        auVar33._12_4_ = *(float *)(uVar9 + 0xac) * fVar32 + *(float *)(uVar9 + 0x4c);
        auVar44._0_4_ = *(float *)(uVar9 + 0xc0) * fVar32 + *(float *)(uVar9 + 0x60);
        auVar44._4_4_ = *(float *)(uVar9 + 0xc4) * fVar32 + *(float *)(uVar9 + 100);
        auVar44._8_4_ = *(float *)(uVar9 + 200) * fVar32 + *(float *)(uVar9 + 0x68);
        auVar44._12_4_ = *(float *)(uVar9 + 0xcc) * fVar32 + *(float *)(uVar9 + 0x6c);
        auVar37._0_4_ = *(float *)(uVar9 + 0x90) * fVar32 + *(float *)(uVar9 + 0x30);
        auVar37._4_4_ = *(float *)(uVar9 + 0x94) * fVar32 + *(float *)(uVar9 + 0x34);
        auVar37._8_4_ = *(float *)(uVar9 + 0x98) * fVar32 + *(float *)(uVar9 + 0x38);
        auVar37._12_4_ = *(float *)(uVar9 + 0x9c) * fVar32 + *(float *)(uVar9 + 0x3c);
        auVar41._0_4_ = *(float *)(uVar9 + 0xb0) * fVar32 + *(float *)(uVar9 + 0x50);
        auVar41._4_4_ = *(float *)(uVar9 + 0xb4) * fVar32 + *(float *)(uVar9 + 0x54);
        auVar41._8_4_ = *(float *)(uVar9 + 0xb8) * fVar32 + *(float *)(uVar9 + 0x58);
        auVar41._12_4_ = *(float *)(uVar9 + 0xbc) * fVar32 + *(float *)(uVar9 + 0x5c);
        auVar45._0_4_ = *(float *)(uVar9 + 0xd0) * fVar32 + *(float *)(uVar9 + 0x70);
        auVar45._4_4_ = *(float *)(uVar9 + 0xd4) * fVar32 + *(float *)(uVar9 + 0x74);
        auVar45._8_4_ = *(float *)(uVar9 + 0xd8) * fVar32 + *(float *)(uVar9 + 0x78);
        auVar45._12_4_ = *(float *)(uVar9 + 0xdc) * fVar32 + *(float *)(uVar9 + 0x7c);
        auVar48._4_4_ = fVar62;
        auVar48._0_4_ = fVar61;
        auVar48._8_4_ = fVar63;
        auVar48._12_4_ = fVar64;
        auVar49 = maxps(auVar48,auVar23);
        auVar49 = minps(auVar49,auVar37);
        fVar47 = auVar49._0_4_ - fVar61;
        fVar52 = auVar49._4_4_ - fVar62;
        fVar53 = auVar49._8_4_ - fVar63;
        fVar54 = auVar49._12_4_ - fVar64;
        auVar56._4_4_ = fVar66;
        auVar56._0_4_ = fVar65;
        auVar56._8_4_ = fVar67;
        auVar56._12_4_ = fVar68;
        auVar49 = maxps(auVar56,auVar33);
        auVar49 = minps(auVar49,auVar41);
        fVar55 = auVar49._0_4_ - fVar65;
        fVar58 = auVar49._4_4_ - fVar66;
        fVar59 = auVar49._8_4_ - fVar67;
        fVar60 = auVar49._12_4_ - fVar68;
        auVar34._4_4_ = fVar70;
        auVar34._0_4_ = fVar69;
        auVar34._8_4_ = fVar71;
        auVar34._12_4_ = fVar72;
        auVar49 = maxps(auVar34,auVar44);
        auVar49 = minps(auVar49,auVar45);
        fVar32 = auVar49._0_4_ - fVar69;
        fVar38 = auVar49._4_4_ - fVar70;
        fVar39 = auVar49._8_4_ - fVar71;
        fVar40 = auVar49._12_4_ - fVar72;
        local_1058[0] = fVar32 * fVar32 + fVar55 * fVar55 + fVar47 * fVar47;
        local_1058[1] = fVar38 * fVar38 + fVar58 * fVar58 + fVar52 * fVar52;
        local_1058[2] = fVar39 * fVar39 + fVar59 * fVar59 + fVar53 * fVar53;
        local_1058[3] = fVar40 * fVar40 + fVar60 * fVar60 + fVar54 * fVar54;
        auVar49._0_4_ = -(uint)(auVar23._0_4_ <= auVar37._0_4_ && local_1058[0] <= fVar73);
        auVar49._4_4_ = -(uint)(auVar23._4_4_ <= auVar37._4_4_ && local_1058[1] <= fVar74);
        auVar49._8_4_ = -(uint)(auVar23._8_4_ <= auVar37._8_4_ && local_1058[2] <= fVar75);
        auVar49._12_4_ = -(uint)(auVar23._12_4_ <= auVar37._12_4_ && local_1058[3] <= fVar76);
        if ((uVar11 & 7) != 6) goto LAB_0057586f;
LAB_005759c0:
        uVar9 = uVar10 & 0xfffffffffffffff0;
        auVar16._0_4_ =
             (-(uint)(auVar18._0_4_ < *(float *)(uVar9 + 0xf0) &&
                     *(float *)(uVar9 + 0xe0) <= auVar18._0_4_) & auVar49._0_4_) << 0x1f;
        auVar16._4_4_ =
             (-(uint)(auVar18._4_4_ < *(float *)(uVar9 + 0xf4) &&
                     *(float *)(uVar9 + 0xe4) <= auVar18._4_4_) & auVar49._4_4_) << 0x1f;
        auVar16._8_4_ =
             (-(uint)(auVar18._8_4_ < *(float *)(uVar9 + 0xf8) &&
                     *(float *)(uVar9 + 0xe8) <= auVar18._8_4_) & auVar49._8_4_) << 0x1f;
        auVar16._12_4_ =
             (-(uint)(auVar18._12_4_ < *(float *)(uVar9 + 0xfc) &&
                     *(float *)(uVar9 + 0xec) <= auVar18._12_4_) & auVar49._12_4_) << 0x1f;
        uVar11 = movmskps(uVar11 & 7,auVar16);
        goto LAB_00575872;
      }
LAB_00575c5b:
      local_1040 = (ulong)(uVar11 & 0xf) - 8;
      lVar14 = (uVar10 & 0xfffffffffffffff0) + 0x40;
      local_1030 = 0;
      for (local_1038 = 0; local_1038 != local_1040; local_1038 = local_1038 + 1) {
        bVar12 = 0;
        for (lVar15 = 0; (lVar15 != 4 && (*(int *)(lVar14 + lVar15 * 4) != -1)); lVar15 = lVar15 + 1
            ) {
          uVar11 = *(uint *)(lVar14 + -0x10 + lVar15 * 4);
          this = (context->scene->geometries).items[uVar11].ptr;
          context->geomID = uVar11;
          context->primID = *(uint *)(lVar14 + lVar15 * 4);
          bVar7 = Geometry::pointQuery(this,query,context);
          bVar12 = bVar12 | bVar7;
          fVar61 = local_f98;
          fVar62 = fStack_f94;
          fVar63 = fStack_f90;
          fVar64 = fStack_f8c;
          fVar65 = local_fa8;
          fVar66 = fStack_fa4;
          fVar67 = fStack_fa0;
          fVar68 = fStack_f9c;
          fVar69 = local_fb8;
          fVar70 = fStack_fb4;
          fVar71 = fStack_fb0;
          fVar72 = fStack_fac;
          fVar73 = local_f88;
          fVar74 = fStack_f84;
          fVar75 = fStack_f80;
          fVar76 = fStack_f7c;
        }
        local_1030 = CONCAT71((int7)(local_1030 >> 8),(byte)local_1030 | bVar12);
        lVar14 = lVar14 + 0x50;
        fVar77 = local_fc8;
      }
    } while ((local_1030 & 1) == 0);
    fVar76 = (context->query_radius).field_0.m128[0];
    fVar73 = (context->query_radius).field_0.m128[1];
    fVar74 = (context->query_radius).field_0.m128[2];
    fStack_fc4 = (context->query_radius).field_0.m128[3];
    if (context->query_type == POINT_QUERY_TYPE_SPHERE) {
      fStack_fc0 = 0.0;
      fStack_fc4 = 0.0;
      fVar77 = query->radius * query->radius;
    }
    else {
      fStack_fc0 = fVar74 * fVar74;
      fStack_fc4 = fStack_fc4 * fStack_fc4;
      fVar77 = fStack_fc0 + fVar73 * fVar73 + fVar76 * fVar76;
    }
    bVar8 = true;
  } while( true );
}

Assistant:

static __forceinline bool pointQuery(const Accel::Intersectors* This, PointQuery* query, PointQueryContext* context)
      {
        const BVH* __restrict__ bvh = (const BVH*)This->ptr;
        
        /* we may traverse an empty BVH in case all geometry was invalid */
        if (bvh->root == BVH::emptyNode)
          return false;
        
        /* stack state */
        StackItemT<NodeRef> stack[stackSize];    // stack of nodes
        StackItemT<NodeRef>* stackPtr = stack+1; // current stack pointer
        StackItemT<NodeRef>* stackEnd = stack+stackSize;
        stack[0].ptr  = bvh->root;
        stack[0].dist = neg_inf;
        
        /* verify correct input */
        assert(!(types & BVH_MB) || (query->time >= 0.0f && query->time <= 1.0f));

        /* load the point query into SIMD registers */
        TravPointQuery<N> tquery(query->p, context->query_radius);

        /* initialize the node traverser */
        BVHNNodeTraverser1Hit<N,types> nodeTraverser;

        bool changed = false;
        float cull_radius = context->query_type == POINT_QUERY_TYPE_SPHERE
                          ? query->radius * query->radius
                          : dot(context->query_radius, context->query_radius);

        /* pop loop */
        while (true) pop:
        {
          /* pop next node */
          if (unlikely(stackPtr == stack)) break;
          stackPtr--;
          NodeRef cur = NodeRef(stackPtr->ptr);

          /* if popped node is too far, pop next one */
          if (unlikely(*(float*)&stackPtr->dist > cull_radius))
            continue;

          /* downtraversal loop */
          while (true)
          {
            /* intersect node */
            size_t mask; vfloat<N> tNear;
            STAT3(point_query.trav_nodes,1,1,1);
            bool nodeIntersected;
            if (likely(context->query_type == POINT_QUERY_TYPE_SPHERE)) {
              nodeIntersected = BVHNNodePointQuerySphere1<N, types>::pointQuery(cur, tquery, query->time, tNear, mask);
            } else {
              nodeIntersected = BVHNNodePointQueryAABB1  <N, types>::pointQuery(cur, tquery, query->time, tNear, mask);
            }
            if (unlikely(!nodeIntersected)) { STAT3(point_query.trav_nodes,-1,-1,-1); break; }

            /* if no child is hit, pop next node */
            if (unlikely(mask == 0))
              goto pop;

            /* select next child and push other children */
            nodeTraverser.traverseClosestHit(cur, mask, tNear, stackPtr, stackEnd);
          }

          /* this is a leaf node */
          assert(cur != BVH::emptyNode);
          STAT3(point_query.trav_leaves,1,1,1);
          size_t num; Primitive* prim = (Primitive*)cur.leaf(num);
          size_t lazy_node = 0;
          if (PrimitiveIntersector1::pointQuery(This, query, context, prim, num, tquery, lazy_node))
          {
            changed = true;
            tquery.rad = context->query_radius;
            cull_radius = context->query_type == POINT_QUERY_TYPE_SPHERE
                        ? query->radius * query->radius
                        : dot(context->query_radius, context->query_radius);
          }

          /* push lazy node onto stack */
          if (unlikely(lazy_node)) {
            stackPtr->ptr = lazy_node;
            stackPtr->dist = neg_inf;
            stackPtr++;
          }
        }
        return changed;
      }